

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_opp(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar4 = (ulong)(*arg1 != 0) + arg1[1];
  uVar5 = -lVar4;
  uVar6 = (ulong)(byte)-(-(lVar4 != 0) - CARRY8((ulong)(*arg1 != 0),arg1[1]));
  lVar4 = uVar6 + arg1[2];
  uVar7 = -lVar4;
  uVar6 = (ulong)(byte)-(-(lVar4 != 0) - CARRY8(uVar6,arg1[2]));
  lVar4 = uVar6 + arg1[3];
  uVar3 = -(ulong)((bool)-(lVar4 != 0) != CARRY8(uVar6,arg1[3]));
  uVar6 = (ulong)CARRY8(uVar3 & 0x7998f7b9022d759b,-*arg1);
  uVar1 = (uVar3 & 0xcf846e86789051d3) + uVar5;
  uVar5 = (ulong)(CARRY8(uVar3 & 0xcf846e86789051d3,uVar5) || CARRY8(uVar1,uVar6));
  uVar2 = (uVar3 & 0xab1ec85e6b41c8aa) + uVar7;
  *out1 = (uVar3 & 0x7998f7b9022d759b) + -*arg1;
  out1[1] = uVar1 + uVar6;
  out1[2] = uVar2 + uVar5;
  out1[3] = ((uVar3 & 0x9b9f605f5a858107) - lVar4) +
            (ulong)(CARRY8(uVar3 & 0xab1ec85e6b41c8aa,uVar7) || CARRY8(uVar2,uVar5));
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_opp(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x8;
    uint64_t x9;
    uint64_t x10;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x11;
    uint64_t x12;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x13;
    uint64_t x14;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x15;
    uint64_t x16;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x1, &x2, 0x0,
                                                               0x0, (arg1[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x3, &x4, x2,
                                                               0x0, (arg1[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x5, &x6, x4,
                                                               0x0, (arg1[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x7, &x8, x6,
                                                               0x0, (arg1[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(
        &x9, x8, 0x0, UINT64_C(0xffffffffffffffff));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x10, &x11, 0x0, x1, (x9 & UINT64_C(0x7998f7b9022d759b)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x12, &x13, x11, x3, (x9 & UINT64_C(0xcf846e86789051d3)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x14, &x15, x13, x5, (x9 & UINT64_C(0xab1ec85e6b41c8aa)));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x16, &x17, x15, x7, (x9 & UINT64_C(0x9b9f605f5a858107)));
    out1[0] = x10;
    out1[1] = x12;
    out1[2] = x14;
    out1[3] = x16;
}